

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet
          (OptionInterpreter *this,const_iterator intermediate_fields_iter,
          const_iterator intermediate_fields_end,FieldDescriptor *innermost_field,
          string *debug_msg_name,UnknownFieldSet *unknown_fields)

{
  int value;
  FieldDescriptor *arg;
  undefined8 *puVar1;
  bool bVar2;
  long *plVar3;
  LogMessage *pLVar4;
  pointer pUVar5;
  ulong uVar6;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar7;
  long lVar8;
  long lVar9;
  UnknownFieldSet intermediate_unknown_fields;
  undefined1 local_88 [16];
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pvVar7 = unknown_fields->fields_;
  if (intermediate_fields_iter._M_current != intermediate_fields_end._M_current) {
    if (pvVar7 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
      return true;
    }
    lVar8 = -1;
    lVar9 = 8;
    do {
      pUVar5 = (pvVar7->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 1;
      if ((int)((ulong)((long)(pvVar7->
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 4) <=
          lVar8) {
        return true;
      }
      arg = *intermediate_fields_iter._M_current;
      if (*(int *)((long)pUVar5 + lVar9 + -8) == *(int *)(arg + 0x38)) {
        if (*(GoogleOnceDynamic **)(arg + 0x40) != (GoogleOnceDynamic *)0x0) {
          GoogleOnceDynamic::Init<google::protobuf::FieldDescriptor_const>
                    (*(GoogleOnceDynamic **)(arg + 0x40),FieldDescriptor::TypeOnceInit,arg);
        }
        value = *(int *)(arg + 0x48);
        if (value == 10) {
          if ((*(int *)((long)pUVar5 + lVar9 + -4) == 4) &&
             (bVar2 = ExamineIfOptionIsSet
                                (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                 intermediate_fields_end,innermost_field,debug_msg_name,
                                 *(UnknownFieldSet **)((long)&pUVar5->number_ + lVar9)), !bVar2)) {
            return false;
          }
        }
        else {
          if (value != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)local_88,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x1874);
            pLVar4 = internal::LogMessage::operator<<
                               ((LogMessage *)local_88,"Invalid wire type for CPPTYPE_MESSAGE: ");
            pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar4);
            internal::LogMessage::~LogMessage((LogMessage *)local_88);
            return false;
          }
          if (*(int *)((long)pUVar5 + lVar9 + -4) == 3) {
            local_88._0_8_ =
                 (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0;
            puVar1 = *(undefined8 **)((long)&pUVar5->number_ + lVar9);
            bVar2 = UnknownFieldSet::ParseFromArray
                              ((UnknownFieldSet *)local_88,(void *)*puVar1,*(int *)(puVar1 + 1));
            if ((bVar2) &&
               (bVar2 = ExamineIfOptionIsSet
                                  (this,(const_iterator)(intermediate_fields_iter._M_current + 1),
                                   intermediate_fields_end,innermost_field,debug_msg_name,
                                   (UnknownFieldSet *)local_88), !bVar2)) {
              if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)local_88._0_8_ ==
                  (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                   *)0x0) {
                return false;
              }
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_88);
              return false;
            }
            if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)local_88._0_8_ !=
                (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
              UnknownFieldSet::ClearFallback((UnknownFieldSet *)local_88);
            }
          }
        }
      }
      lVar9 = lVar9 + 0x10;
      pvVar7 = unknown_fields->fields_;
      if (pvVar7 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                     *)0x0) {
        return true;
      }
    } while( true );
  }
  if (pvVar7 == (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                 *)0x0) {
    return true;
  }
  pUVar5 = (pvVar7->
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (ulong)((long)(pvVar7->
                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar5) >> 4;
  if (0 < (int)uVar6) {
    uVar6 = uVar6 & 0xffffffff;
    do {
      if (pUVar5->number_ == *(uint32 *)(innermost_field + 0x38)) {
        std::operator+(&local_50,"Option \"",debug_msg_name);
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
        pvVar7 = (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)(plVar3 + 2);
        if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)*plVar3 == pvVar7) {
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar7->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)plVar3[3];
          local_88._0_8_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)(local_88 + 0x10);
        }
        else {
          local_78.
          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pvVar7->
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               )._M_impl.super__Vector_impl_data._M_start;
          local_88._0_8_ =
               (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                *)*plVar3;
        }
        local_88._8_8_ = plVar3[1];
        *plVar3 = (long)pvVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)local_88);
        if ((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)local_88._0_8_ !=
            (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)(local_88 + 0x10)) {
          operator_delete((void *)local_88._0_8_,
                          (ulong)((long)local_78.
                                        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        return false;
      }
      pUVar5 = pUVar5 + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
    return true;
  }
  return true;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::ExamineIfOptionIsSet(
    std::vector<const FieldDescriptor*>::const_iterator
        intermediate_fields_iter,
    std::vector<const FieldDescriptor*>::const_iterator intermediate_fields_end,
    const FieldDescriptor* innermost_field, const string& debug_msg_name,
    const UnknownFieldSet& unknown_fields) {
  // We do linear searches of the UnknownFieldSet and its sub-groups.  This
  // should be fine since it's unlikely that any one options structure will
  // contain more than a handful of options.

  if (intermediate_fields_iter == intermediate_fields_end) {
    // We're at the innermost submessage.
    for (int i = 0; i < unknown_fields.field_count(); i++) {
      if (unknown_fields.field(i).number() == innermost_field->number()) {
        return AddNameError("Option \"" + debug_msg_name +
                            "\" was already set.");
      }
    }
    return true;
  }

  for (int i = 0; i < unknown_fields.field_count(); i++) {
    if (unknown_fields.field(i).number() ==
        (*intermediate_fields_iter)->number()) {
      const UnknownField* unknown_field = &unknown_fields.field(i);
      FieldDescriptor::Type type = (*intermediate_fields_iter)->type();
      // Recurse into the next submessage.
      switch (type) {
        case FieldDescriptor::TYPE_MESSAGE:
          if (unknown_field->type() == UnknownField::TYPE_LENGTH_DELIMITED) {
            UnknownFieldSet intermediate_unknown_fields;
            if (intermediate_unknown_fields.ParseFromString(
                    unknown_field->length_delimited()) &&
                !ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      intermediate_unknown_fields)) {
              return false;  // Error already added.
            }
          }
          break;

        case FieldDescriptor::TYPE_GROUP:
          if (unknown_field->type() == UnknownField::TYPE_GROUP) {
            if (!ExamineIfOptionIsSet(intermediate_fields_iter + 1,
                                      intermediate_fields_end,
                                      innermost_field, debug_msg_name,
                                      unknown_field->group())) {
              return false;  // Error already added.
            }
          }
          break;

        default:
          GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: " << type;
          return false;
      }
    }
  }
  return true;
}